

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::JumpIfFalse(VirtualMachine *this)

{
  bool bVar1;
  Variable VVar2;
  Variable var;
  Variable top;
  VirtualMachine *this_local;
  
  VVar2 = popOpStack(this);
  var.field_1 = VVar2.field_1;
  var._4_4_ = 0;
  var.type = VVar2.type;
  bVar1 = booleanValueOfVariable(this,var);
  if (bVar1) {
    advance(this);
  }
  else {
    Jump(this);
  }
  return;
}

Assistant:

void runtime::VirtualMachine::JumpIfFalse() {
  Variable top{this->popOpStack()};

  if (!this->booleanValueOfVariable(top)) {
    this->Jump();
  } else {
    this->advance();
  }
}